

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int match_tzname(date_parse_result *res,char **str,size_t *len)

{
  int iVar1;
  char *pcVar2;
  CVmTimeZone *pCVar3;
  ulong *in_RDX;
  long *in_RSI;
  long in_RDI;
  int32_t tzofs;
  CVmTimeZone *tz;
  size_t rem;
  char *p;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  char *name;
  CVmTimeZoneCache *this;
  char *local_28;
  
  if ((*in_RDX != 0) && (iVar1 = isalpha((int)*(char *)*in_RSI), iVar1 != 0)) {
    local_28 = (char *)*in_RSI;
    this = (CVmTimeZoneCache *)*in_RDX;
    while ((this != (CVmTimeZoneCache *)0x0 &&
           ((iVar1 = isalpha((int)*local_28), iVar1 != 0 ||
            ((((*local_28 == '_' || (*local_28 == '/')) && ((CVmTimeZoneCache *)0x1 < this)) &&
             (iVar1 = isalpha((int)local_28[1]), iVar1 != 0))))))) {
      local_28 = local_28 + 1;
      this = (CVmTimeZoneCache *)((long)&this[-1].abbr_bytes_ + 7);
    }
    name = (char *)0x0;
    pcVar2 = lib_strnchr((char *)*in_RSI,(long)local_28 - *in_RSI,0x2f);
    if ((pcVar2 != (char *)0x0) &&
       (pCVar3 = CVmTimeZoneCache::get_db_zone
                           (this,name,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
       , pCVar3 != (CVmTimeZone *)0x0)) {
      *(long *)(in_RDI + 0x108) = *in_RSI;
      *(long *)(in_RDI + 0x110) = (long)local_28 - *in_RSI;
      *in_RSI = (long)local_28;
      *in_RDX = (ulong)this;
      *(CVmTimeZone **)(in_RDI + 0x38) = pCVar3;
      return 1;
    }
    pCVar3 = CVmTimeZoneCache::get_zone_by_abbr
                       ((CVmTimeZoneCache *)len,(int32_t *)p,(char *)rem,(size_t)tz);
    if (pCVar3 != (CVmTimeZone *)0x0) {
      *(long *)(in_RDI + 0x108) = *in_RSI;
      *(long *)(in_RDI + 0x110) = (long)local_28 - *in_RSI;
      *in_RSI = (long)local_28;
      *in_RDX = (ulong)this;
      *(CVmTimeZone **)(in_RDI + 0x38) = pCVar3;
      if (in_stack_ffffffffffffffc4 != -0x80000000) {
        *(int *)(in_RDI + 0x40) = in_stack_ffffffffffffffc4;
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

static int match_tzname(VMG_ date_parse_result *res,
                        const char *&str, size_t &len)
{
    /* check for a zone name string ("America/Los_Angeles", etc) */
    if (len != 0 && isalpha(*str))
    {
        const char *p = str;
        size_t rem = len;
        for ( ; rem != 0 ; ++p, --rem)
        {
            /* allow letters, or / or _ if followed by a letter */
            if (isalpha(*p)
                || ((*p == '_' || *p == '/')
                    && rem > 1 && isalpha(p[1])))
                continue;

            /* otherwise we're done */
            break;
        }

        /* if it contains a slash, look up the zoneinfo database name */
        CVmTimeZone *tz = 0;
        if (lib_strnchr(str, p - str, '/') != 0)
        {
            if ((tz = G_tzcache->get_db_zone(vmg_ str, p - str)) != 0)
            {
                /* success - this is a valid timezone name */
                res->ptz.p = str;
                res->ptz.len = p - str;
                str = p;
                len = rem;
                res->tz = tz;
                return TRUE;
            }
        }

        /* didn't find a zone name; try an abbreviation */
        int32_t tzofs;
        tz = G_tzcache->get_zone_by_abbr(vmg_ &tzofs, str, p - str);
        if (tz != 0)
        {
            /* 
             *   Success - we found an abbreviation; this usually gives us
             *   both a timezone and a specific offset, since an abbreviation
             *   is specific to standard or daylight time.  However, some
             *   abbreviations don't specify an offset, since they're used in
             *   the same zone for both standard and daylight time (e.g.,
             *   Australian EST); these are flagged by tzofs coming back as
             *   INT32MINVAL.
             */
            res->ptz.p = str;
            res->ptz.len = p - str;
            str = p;
            len = rem;
            res->tz = tz;
            if (tzofs != INT32MINVAL)
                res->tzofs = tzofs;
            return TRUE;
        }
    }

    /* not a time zone */
    return FALSE;
}